

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

void __thiscall
Centaurus::NFABaseState<wchar_t,_int>::rebase_transitions
          (NFABaseState<wchar_t,_int> *this,NFABaseState<wchar_t,_int> *src,int offset_value)

{
  pointer pNVar1;
  pointer this_00;
  NFATransition<wchar_t> local_60;
  
  pNVar1 = (src->m_transitions).
           super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (src->m_transitions).
                 super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pNVar1; this_00 = this_00 + 1
      ) {
    NFATransition<wchar_t>::offset(&local_60,this_00,offset_value);
    std::
    vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>::
    push_back(&this->m_transitions,&local_60);
    NFATransition<wchar_t>::~NFATransition(&local_60);
  }
  return;
}

Assistant:

void rebase_transitions(const NFABaseState<TCHAR, TLABEL>& src, int offset_value)
    {
        for (const auto& i : src.m_transitions)
        {
            add_transition(i.offset(offset_value));
        }
    }